

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmSyRU.cpp
# Opt level: O0

void __thiscall EmSyRU::uploadLog(EmSyRU *this)

{
  int iVar1;
  Logger *lg;
  ostream *poVar2;
  long in_RDI;
  string *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffed8;
  allocator *paVar3;
  undefined4 in_stack_fffffffffffffee0;
  uint uVar4;
  undefined4 in_stack_fffffffffffffee4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef8;
  Logger *in_stack_ffffffffffffff00;
  string local_e8 [24];
  string *in_stack_ffffffffffffff30;
  UnixBridge *in_stack_ffffffffffffff38;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"STATUS: Uploading logfile to ",&local_29);
  lg = (Logger *)operator<<(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::operator+(in_stack_fffffffffffffee8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  poVar2 = std::operator<<((ostream *)lg,local_60);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (in_RDI + 0x1b0),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  std::__cxx11::string::string(local_a0,(string *)(in_RDI + 0x20));
  iVar1 = CurlCommunicator::startUpload
                    ((CurlCommunicator *)
                     CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                     in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  uVar4 = (uint)(iVar1 != 0) << 0x18 ^ 0xff000000;
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_80);
  if ((uVar4 & 0x1000000) != 0) {
    paVar3 = (allocator *)&stack0xffffffffffffff3f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"ERROR: Failed to upload logfile ",paVar3);
    poVar2 = operator<<(lg,(string *)poVar2);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
  }
  std::__cxx11::string::string(local_e8,(string *)(in_RDI + 0x80));
  UnixBridge::deleteDir(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::__cxx11::string::~string(local_e8);
  return;
}

Assistant:

void EmSyRU::uploadLog()
{
	log_ << "STATUS: Uploading logfile to " << upURL_ + logFile_ << endl;
	if(!curli_.startUpload(upURL_ + logFile_, logFile_))
		log_ << "ERROR: Failed to upload logfile " << endl;
	ub_.deleteDir(env_);
}